

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_move_assignment_operator_Test::TestBody
          (IntrusiveListTest_move_assignment_operator_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator<int> local_c5;
  int local_c4 [3];
  iterator local_b8;
  size_type local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_78 [8];
  TestObjectList list2;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list1;
  IntrusiveListTest_move_assignment_operator_Test *this_local;
  
  list2.size_._4_4_ = 1;
  list1.size_ = (size_t)this;
  std::allocator<int>::allocator((allocator<int> *)((long)&list2.size_ + 3));
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)((long)&list2.size_ + 4);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,__l_00,(allocator_type *)((long)&list2.size_ + 3));
  anon_unknown.dwarf_4eaaf::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator((allocator<int> *)((long)&list2.size_ + 3));
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::operator=
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78,
             (intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  memset(&local_90,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_90);
  anon_unknown.dwarf_4eaaf::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_90);
  std::vector<int,_std::allocator<int>_>::~vector(&local_90);
  local_c4[0] = 1;
  local_c4[1] = 2;
  local_c4[2] = 3;
  local_b8 = local_c4;
  local_b0 = 3;
  std::allocator<int>::allocator(&local_c5);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l,&local_c5);
  anon_unknown.dwarf_4eaaf::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_78,&local_a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a8);
  std::allocator<int>::~allocator(&local_c5);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_78);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, move_assignment_operator) {
  TestObjectList list1 = NewList({1, 2, 3});
  TestObjectList list2;

  list2 = std::move(list1);
  AssertListEq(list1, {});
  AssertListEq(list2, {1, 2, 3});
}